

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackIR.cpp
# Opt level: O0

void __thiscall wasm::StackIROptimizer::removeUnneededBlocks(StackIROptimizer *this)

{
  vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_> *this_00;
  Expression *tree;
  bool bVar1;
  reference ppSVar2;
  BranchSeeker *this_01;
  Name target;
  Block *block;
  StackInst **inst;
  iterator __end2;
  iterator __begin2;
  StackIR *__range2;
  StackIROptimizer *this_local;
  
  this_00 = this->insts;
  __end2 = std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::begin(this_00);
  inst = (StackInst **)
         std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<wasm::StackInst_**,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>
                                     *)&inst), bVar1) {
    ppSVar2 = __gnu_cxx::
              __normal_iterator<wasm::StackInst_**,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>
              ::operator*(&__end2);
    if (((*ppSVar2 != (StackInst *)0x0) &&
        (this_01 = (BranchSeeker *)Expression::dynCast<wasm::Block>((*ppSVar2)->origin),
        this_01 != (BranchSeeker *)0x0)) &&
       (tree = (Expression *)
               (this_01->
               super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
               ).
               super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
               .stack.fixed._M_elems[0].func, target.super_IString.str._M_str = (char *)tree,
       target.super_IString.str._M_len =
            (size_t)(this_01->
                    super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                    ).
                    super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                    .stack.fixed._M_elems[0].currp,
       bVar1 = BranchUtils::BranchSeeker::has(this_01,tree,target), !bVar1)) {
      *ppSVar2 = (StackInst *)0x0;
    }
    __gnu_cxx::
    __normal_iterator<wasm::StackInst_**,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void removeUnneededBlocks() {
    for (auto*& inst : insts) {
      if (!inst) {
        continue;
      }
      if (auto* block = inst->origin->dynCast<Block>()) {
        if (!BranchUtils::BranchSeeker::has(block, block->name)) {
          // TODO optimize, maybe run remove-unused-names
          inst = nullptr;
        }
      }
    }
  }